

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float16_round_to_int_arm(float16 a,float_status *s)

{
  float16 fVar1;
  FloatParts FVar2;
  FloatParts pr;
  FloatParts pa;
  float_status *s_local;
  float16 a_local;
  
  FVar2 = float16_unpack_canonical(a,s);
  FVar2 = round_to_int(FVar2,(int)s->float_rounding_mode,0,s);
  fVar1 = float16_round_pack_canonical(FVar2,s);
  return fVar1;
}

Assistant:

float16 float16_round_to_int(float16 a, float_status *s)
{
    FloatParts pa = float16_unpack_canonical(a, s);
    FloatParts pr = round_to_int(pa, s->float_rounding_mode, 0, s);
    return float16_round_pack_canonical(pr, s);
}